

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::SstReader::DestructorClose(SstReader *this,bool Verbose)

{
  ostream *poVar1;
  byte in_SIL;
  long in_RDI;
  
  if ((in_SIL & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"SST Reader \"");
    poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x30));
    poVar1 = std::operator<<(poVar1,"\" Destroyed without a prior Close().");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "This may result in \"unexpected close\" or \"failed to send\" warning from a connected SST Writer."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  *(undefined1 *)(in_RDI + 0x80) = 0;
  return;
}

Assistant:

void SstReader::DestructorClose(bool Verbose) noexcept
{
    if (Verbose)
    {
        std::cerr << "SST Reader \"" << m_Name << "\" Destroyed without a prior Close()."
                  << std::endl;
        std::cerr << "This may result in \"unexpected close\" or \"failed to "
                     "send\" warning from a connected SST Writer."
                  << std::endl;
    }
    m_IsOpen = false;
}